

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O3

void __thiscall bdNode::genNewTransId(bdNode *this,bdToken *token)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  string num;
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  transIdCounter = transIdCounter + 1;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  bd_sprintf(&local_30,"%02lx");
  uVar1 = 0x14;
  if ((int)(uint)local_30._M_string_length < 0x14) {
    uVar1 = (uint)local_30._M_string_length;
  }
  if (0 < (int)(uint)local_30._M_string_length) {
    uVar2 = 1;
    if (1 < (int)uVar1) {
      uVar2 = (ulong)uVar1;
    }
    uVar3 = 0;
    do {
      token->data[uVar3] = local_30._M_dataplus._M_p[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  token->len = uVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void bdNode::genNewTransId(bdToken *token) {
	/* generate message, send to udp */
#ifdef DEBUG_NODE_ACTIONS 
	fprintf(stderr, "bdNode::genNewTransId()");
	fprintf(stderr, ")\n");
#endif
	std::string num;
	bd_sprintf(num, "%02lx", transIdCounter++);
	int len = num.size();
	if (len > BITDHT_TOKEN_MAX_LEN)
		len = BITDHT_TOKEN_MAX_LEN;

	for (int i = 0; i < len; i++)
		token->data[i] = num[i];
	token->len = len;
}